

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetCurrentViewport(ImGuiWindow *current_window,ImGuiViewportP *viewport)

{
  ImGuiContext *pIVar1;
  ImGuiViewportP *in_RSI;
  ImGuiContext *g;
  float local_1c;
  
  pIVar1 = GImGui;
  if (in_RSI != (ImGuiViewportP *)0x0) {
    in_RSI->LastFrameActive = GImGui->FrameCount;
  }
  if (pIVar1->CurrentViewport != in_RSI) {
    if (in_RSI == (ImGuiViewportP *)0x0) {
      local_1c = 1.0;
    }
    else {
      local_1c = (in_RSI->super_ImGuiViewport).DpiScale;
    }
    pIVar1->CurrentDpiScale = local_1c;
    pIVar1->CurrentViewport = in_RSI;
    if ((pIVar1->CurrentViewport != (ImGuiViewportP *)0x0) &&
       ((pIVar1->PlatformIO).Platform_OnChangedViewport != (_func_void_ImGuiViewport_ptr *)0x0)) {
      (*(pIVar1->PlatformIO).Platform_OnChangedViewport)
                (&pIVar1->CurrentViewport->super_ImGuiViewport);
    }
  }
  return;
}

Assistant:

void ImGui::SetCurrentViewport(ImGuiWindow* current_window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    (void)current_window;

    if (viewport)
        viewport->LastFrameActive = g.FrameCount;
    if (g.CurrentViewport == viewport)
        return;
    g.CurrentDpiScale = viewport ? viewport->DpiScale : 1.0f;
    g.CurrentViewport = viewport;
    //IMGUI_DEBUG_LOG_VIEWPORT("SetCurrentViewport changed '%s' 0x%08X\n", current_window ? current_window->Name : NULL, viewport ? viewport->ID : 0);

    // Notify platform layer of viewport changes
    // FIXME-DPI: This is only currently used for experimenting with handling of multiple DPI
    if (g.CurrentViewport && g.PlatformIO.Platform_OnChangedViewport)
        g.PlatformIO.Platform_OnChangedViewport(g.CurrentViewport);
}